

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextWindowSize(ImVec2 *size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  ImGuiCond local_28;
  bool local_21;
  ImGuiContext *g;
  ImGuiCond cond_local;
  ImVec2 *size_local;
  
  pIVar1 = GImGui;
  local_21 = true;
  if (cond != 0) {
    local_21 = ImIsPowerOfTwo(cond);
  }
  if (local_21 != false) {
    (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 2;
    (pIVar1->NextWindowData).SizeVal = *size;
    local_28 = cond;
    if (cond == 0) {
      local_28 = 1;
    }
    (pIVar1->NextWindowData).SizeCond = local_28;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JoelLinn[P]py-mahi-gui/thirdparty/mahi-gui/3rdparty/imgui/imgui.cpp"
                ,0x1c73,"void ImGui::SetNextWindowSize(const ImVec2 &, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowSize(const ImVec2& size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSize;
    g.NextWindowData.SizeVal = size;
    g.NextWindowData.SizeCond = cond ? cond : ImGuiCond_Always;
}